

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall sing::HttpResponse::makeResponse(HttpResponse *this,HttpStatusCode code,bool close)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  HttpStatusCode local_204;
  string local_200;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  char *local_128;
  void *mmRet;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  int local_d8;
  allocator<char> local_d1;
  int srcFd;
  allocator<char> local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  byte local_52;
  allocator<char> local_51;
  string local_50 [32];
  _Self local_30;
  HttpStatusCode local_24;
  _Self local_20;
  const_iterator it;
  bool close_local;
  HttpStatusCode code_local;
  HttpResponse *this_local;
  
  this->closeConn = close;
  it._M_node._3_1_ = close;
  it._M_node._4_4_ = code;
  setStatusCode(this,code);
  local_24 = it._M_node._4_4_;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&statusCode2Message_abi_cxx11_,(key_type *)&local_24);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&statusCode2Message_abi_cxx11_);
  bVar1 = std::operator==(&local_20,&local_30);
  if (bVar1) {
    setStatusCode(this,Code400_BadRequest);
  }
  if (this->code == Code200_Ok) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = std::operator==(&this->path,"/");
      local_52 = 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_52 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_50,"/index.html",&local_51);
      }
      else {
        std::__cxx11::string::string(local_50,(string *)&this->path);
      }
      std::__cxx11::string::operator=((string *)&this->path,local_50);
      std::__cxx11::string::~string(local_50);
      if ((local_52 & 1) != 0) {
        std::allocator<char>::~allocator(&local_51);
      }
      std::operator+(&local_88,&this->srcDir,&this->path);
      pcVar4 = (char *)std::__cxx11::string::data();
      iVar2 = stat(pcVar4,(stat *)&this->mmFileStat);
      bVar1 = true;
      if (-1 < iVar2) {
        bVar1 = ((this->mmFileStat).st_mode & 0xf000) == 0x4000;
      }
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar1) {
        setStatusCode(this,Code404_NotFound);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"File Not Found",&local_a9);
        makeErrorResponse(this,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
      }
      else if (((this->mmFileStat).st_mode & 4) == 0) {
        setStatusCode(this,Code403_Forbidden);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&srcFd,"Access Denied",&local_d1);
        makeErrorResponse(this,(string *)&srcFd);
        std::__cxx11::string::~string((string *)&srcFd);
        std::allocator<char>::~allocator(&local_d1);
      }
      else {
        std::operator+(&local_f8,&this->srcDir,&this->path);
        pcVar4 = (char *)std::__cxx11::string::data();
        iVar2 = open(pcVar4,0);
        std::__cxx11::string::~string((string *)&local_f8);
        local_d8 = iVar2;
        if (iVar2 < 0) {
          setStatusCode(this,Code404_NotFound);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"File Not Found1",(allocator<char> *)((long)&mmRet + 7));
          makeErrorResponse(this,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator((allocator<char> *)((long)&mmRet + 7));
        }
        else {
          local_128 = (char *)mmap((void *)0x0,(this->mmFileStat).st_size,1,2,iVar2,0);
          if (local_128 == (char *)0xffffffffffffffff) {
            setStatusCode(this,Code404_NotFound);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,"File Not Found2",&local_149);
            makeErrorResponse(this,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator(&local_149);
            return;
          }
          this->mmFile = local_128;
          ::close(local_d8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"Content-Type",&local_171);
          getFileType_abi_cxx11_(&local_198,this);
          addHeader(this,&local_170,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator(&local_171);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b8,"Content-Length",&local_1b9);
          std::__cxx11::to_string(&local_1e0,(this->mmFileStat).st_size);
          addHeader(this,&local_1b8,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
        }
      }
    }
    local_204 = this->code;
    pmVar5 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&statusCode2Message_abi_cxx11_,(key_type *)&local_204);
    std::__cxx11::string::string((string *)&local_200,(string *)pmVar5);
    setStatusMessage(this,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  else {
    makeErrorResponse(this,&this->statusMessage);
  }
  return;
}

Assistant:

void HttpResponse::makeResponse(HttpStatusCode code, bool close){
    //set keep alive
    closeConn = close;

    //set code
    setStatusCode(code);
    auto it = statusCode2Message.find(code);
    if(it==statusCode2Message.end()){
        setStatusCode(Code400_BadRequest);
    }

    //----------------do err response-----------------------//
    if(this->code!=Code200_Ok){
        makeErrorResponse(statusMessage);
        return;
    }

    //----------------do static request---------------------//
    if(!path.empty()){
        path = path=="/"?"/index.html":path;
        // if(path=="/"){
        //     body = "Sing Welcome!";
        //     addHeader("Content-length", std::to_string(body.size()));
        //     addHeader("Content-type", "text/html");
        // }
        /* 判断请求的资源文件 */
        if(stat((srcDir + path).data(), &mmFileStat) < 0 || S_ISDIR(mmFileStat.st_mode)) {
            setStatusCode(Code404_NotFound);
            makeErrorResponse("File Not Found");
        }
        else if(!(mmFileStat.st_mode & S_IROTH)) {
            setStatusCode(Code403_Forbidden);
            makeErrorResponse("Access Denied");
        }
        else { 
            int srcFd = open((srcDir + path).data(), O_RDONLY);
            if(srcFd < 0) {
                setStatusCode(Code404_NotFound);
                makeErrorResponse("File Not Found1");
            }else{
                /* 将文件映射到内存提高文件的访问速度 MAP_PRIVATE 建立一个写入时拷贝的私有映射*/
                void* mmRet = mmap(0, (size_t)mmFileStat.st_size, PROT_READ, MAP_PRIVATE, srcFd, 0);
                if(mmRet == (void*)-1) {
                    setStatusCode(Code404_NotFound);
                    makeErrorResponse("File Not Found2");
                    return; 
                }
                mmFile = static_cast<char*>(mmRet);
                ::close(srcFd);

                addHeader("Content-Type", getFileType());
                addHeader("Content-Length", std::to_string(mmFileStat.st_size));
            }
        }
    }

    setStatusMessage(statusCode2Message.at(this->code));

}